

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O2

string * duckdb::Bit::NumericToBit<double>(string *__return_storage_ptr__,double numeric)

{
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  anon_union_16_2_67f50693_for_value local_18;
  
  buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)operator_new__(9);
  local_18.pointer.length = 9;
  local_18._13_2_ = 0;
  local_18.inlined.inlined[0xb] = '\0';
  local_18._4_8_ =
       *(undefined8 *)
        buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_18.inlined.inlined[8] =
       *(char *)((long)buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
                       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl + 8);
  NumericToBit<double>(numeric,(bitstring_t *)&local_18.pointer);
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_18.pointer);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            (&buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>);
  return __return_storage_ptr__;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}